

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O3

string * stackjit::Runtime::getExecutableDir_abi_cxx11_(void)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  string *in_RDI;
  char temp [32];
  char buffer [512];
  char acStack_238 [24];
  char acStack_220 [8];
  char local_218 [512];
  
  uVar1 = getpid();
  sprintf(acStack_238,"/proc/%d/exe",(ulong)uVar1);
  uVar2 = readlink(acStack_238,local_218,0x200);
  uVar3 = 0x1ff;
  if ((int)uVar2 < 0x1ff) {
    uVar3 = uVar2 & 0xffffffff;
  }
  if (-1 < (int)uVar2) {
    local_218[uVar3] = '\0';
  }
  local_218[(long)(int)uVar3 + -8] = '\0';
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  strlen(local_218);
  std::__cxx11::string::_M_construct<char_const*>();
  return in_RDI;
}

Assistant:

std::string getExecutableDir() {
			const int bufferSize = 512;
			char buffer[bufferSize];
			char temp[32];
			sprintf(temp, "/proc/%d/exe", getpid());
			int bytes = std::min((int)readlink(temp, buffer, bufferSize), bufferSize - 1);

			if (bytes >= 0) {
				buffer[bytes] = '\0';
			}

			//Remove the name
			buffer[bytes - 8] = '\0';
			return std::string(buffer);
		}